

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O1

void __thiscall
agge::tests::ArcCurveTests::RewindingArcIteratorStartsOverWithPoints(ArcCurveTests *this)

{
  bool bVar1;
  FailedAssertion *this_00;
  arc a;
  undefined1 local_d0 [8];
  undefined4 local_c8;
  char local_c0 [24];
  point local_a8;
  char *local_98;
  int local_90;
  string local_88;
  string local_68;
  arc local_48;
  
  arc::arc(&local_48,13.1,-17.2,10.1,0.7853982,4.712389,0.05);
  local_c8 = 0;
  local_d0 = (undefined1  [8])0x0;
  arc::vertex(&local_48,(real_t *)local_d0,(real_t *)(local_d0 + 4));
  local_c8 = 0;
  local_d0 = (undefined1  [8])0x0;
  arc::vertex(&local_48,(real_t *)local_d0,(real_t *)(local_d0 + 4));
  arc::rewind(&local_48,(FILE *)0x0);
  local_c8 = 0;
  local_d0 = (undefined1  [8])0x0;
  local_90 = arc::vertex(&local_48,(real_t *)local_d0,(real_t *)(local_d0 + 4));
  local_98 = (char *)local_d0;
  local_a8.x = 20.24178;
  local_a8.y = -10.058222;
  local_a8.command = 1;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_d0,&local_88,0x19b);
  bVar1 = mocks::path::point::operator==(&local_a8,(point *)&local_98);
  if (bVar1) {
    if (local_d0 != (undefined1  [8])local_c0) {
      operator_delete((void *)local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_68,(LocationInfo *)local_d0);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( RewindingArcIteratorStartsOverWithPoints )
			{
				// INIT
				arc a(13.1f, -17.2f, 10.1f, 0.25f * pi, 1.5f * pi);

				vertex(a), vertex(a);

				// ACT
				a.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(a), };
				mocks::path::point reference[] = { moveto(13.1f + 10.1f * sqrtf(2) / 2.0f, -17.2f + 10.1f * sqrtf(2) / 2.0f), };

				assert_equal(reference, points);
			}